

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_portable_deserialize_safe(char *buf,size_t maxbytes)

{
  _Bool _Var1;
  _Bool is_ok;
  size_t bytesread;
  roaring_bitmap_t *ans;
  size_t *in_stack_00000050;
  size_t in_stack_00000058;
  char *in_stack_00000060;
  roaring_array_t *in_stack_00000068;
  roaring_bitmap_t *local_8;
  
  local_8 = (roaring_bitmap_t *)roaring_malloc(0x1642d8);
  if (local_8 == (roaring_bitmap_t *)0x0) {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  else {
    _Var1 = ra_portable_deserialize
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
    if (_Var1) {
      roaring_bitmap_set_copy_on_write(local_8,false);
      if (!_Var1) {
        roaring_free((void *)0x164348);
        local_8 = (roaring_bitmap_t *)0x0;
      }
    }
    else {
      roaring_free((void *)0x164320);
      local_8 = (roaring_bitmap_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_portable_deserialize_safe(const char *buf,
                                                           size_t maxbytes) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (ans == NULL) {
        return NULL;
    }
    size_t bytesread;
    bool is_ok = ra_portable_deserialize(&ans->high_low_container, buf,
                                         maxbytes, &bytesread);
    if (!is_ok) {
        roaring_free(ans);
        return NULL;
    }
    roaring_bitmap_set_copy_on_write(ans, false);
    if (!is_ok) {
        roaring_free(ans);
        return NULL;
    }
    return ans;
}